

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDDMAP mtbdd_map_removeall(MTBDDMAP map,MTBDD variables)

{
  int iVar1;
  uint32_t var;
  uint32_t uVar2;
  mtbddnode_t n;
  mtbddnode_t n_00;
  MTBDD MVar3;
  MTBDDMAP low_00;
  MTBDD variables_00;
  MTBDDMAP low;
  uint32_t k2;
  uint32_t k1;
  mtbddnode_t n2;
  mtbddnode_t n1;
  MTBDD variables_local;
  MTBDDMAP map_local;
  
  iVar1 = mtbdd_map_isempty(map);
  map_local = map;
  if ((iVar1 == 0) && (variables != 0x8000000000000000)) {
    n = MTBDD_GETNODE(map);
    n_00 = MTBDD_GETNODE(variables);
    var = mtbddnode_getvariable(n);
    uVar2 = mtbddnode_getvariable(n_00);
    if (var < uVar2) {
      MVar3 = mtbddnode_followlow(map,n);
      low_00 = mtbdd_map_removeall(MVar3,variables);
      MVar3 = mtbddnode_followhigh(map,n);
      map_local = mtbdd_makemapnode(var,low_00,MVar3);
    }
    else if (uVar2 < var) {
      MVar3 = mtbddnode_followhigh(variables,n_00);
      map_local = mtbdd_map_removeall(map,MVar3);
    }
    else {
      MVar3 = mtbddnode_followlow(map,n);
      variables_00 = mtbddnode_followhigh(variables,n_00);
      map_local = mtbdd_map_removeall(MVar3,variables_00);
    }
  }
  return map_local;
}

Assistant:

MTBDDMAP
mtbdd_map_removeall(MTBDDMAP map, MTBDD variables)
{
    if (mtbdd_map_isempty(map)) return map;
    if (variables == mtbdd_true) return map;

    mtbddnode_t n1 = MTBDD_GETNODE(map);
    mtbddnode_t n2 = MTBDD_GETNODE(variables);
    uint32_t k1 = mtbddnode_getvariable(n1);
    uint32_t k2 = mtbddnode_getvariable(n2);

    if (k1 < k2) {
        MTBDDMAP low = mtbdd_map_removeall(node_getlow(map, n1), variables);
        return mtbdd_makemapnode(k1, low, node_gethigh(map, n1));
    } else if (k1 > k2) {
        return mtbdd_map_removeall(map, node_gethigh(variables, n2));
    } else {
        return mtbdd_map_removeall(node_getlow(map, n1), node_gethigh(variables, n2));
    }
}